

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.cpp
# Opt level: O2

void __thiscall Memory::~Memory(Memory *this)

{
  int iVar1;
  int *piVar2;
  char *__s;
  string local_38;
  allocator<char> local_11;
  
  iVar1 = munmap(this->start_address,this->size);
  if (iVar1 == -1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"munmap failed with error:",&local_11);
    Logger::log_error(&local_38,true);
    std::__cxx11::string::~string((string *)&local_38);
    piVar2 = __errno_location();
    __s = strerror(*piVar2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,__s,&local_11);
    Logger::log_data(&local_38,true);
    std::__cxx11::string::~string((string *)&local_38);
  }
  std::_Vector_base<BitFlip,_std::allocator<BitFlip>_>::~_Vector_base
            (&(this->flipped_bits).super__Vector_base<BitFlip,_std::allocator<BitFlip>_>);
  std::__cxx11::string::~string((string *)&this->hugetlbfs_mountpoint);
  return;
}

Assistant:

Memory::~Memory() {
  if (munmap((void *) start_address, size)==-1) {
    Logger::log_error("munmap failed with error:");
    Logger::log_data(std::strerror(errno));
  }
}